

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

void djgt_release(djg_texture *texture)

{
  djg_texture *pdVar1;
  
  if (texture == (djg_texture *)0x0) {
    __assert_fail("texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x31d,"void djgt_release(djg_texture *)");
  }
  while (texture != (djg_texture *)0x0) {
    pdVar1 = texture->next;
    free(texture->texels);
    free(texture);
    texture = pdVar1;
  }
  return;
}

Assistant:

DJGDEF void djgt_release(djg_texture *texture)
{
    djg_texture *tmp;

    DJG_ASSERT(texture);
    while (texture) {
        tmp = texture;
        texture = texture->next;
        DJG_FREE(tmp->texels);
        DJG_FREE(tmp);
    }
}